

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

bool spdlog::details::os::fopen_s(FILE **fp,filename_t *filename,filename_t *mode)

{
  FILE *pFVar1;
  
  pFVar1 = fopen((filename->_M_dataplus)._M_p,(mode->_M_dataplus)._M_p);
  *fp = (FILE *)pFVar1;
  return pFVar1 == (FILE *)0x0;
}

Assistant:

SPDLOG_INLINE bool fopen_s(FILE **fp, const filename_t &filename, const filename_t &mode)
{
#ifdef _WIN32
#    ifdef SPDLOG_WCHAR_FILENAMES
    *fp = ::_wfsopen((filename.c_str()), mode.c_str(), _SH_DENYNO);
#    else
    *fp = ::_fsopen((filename.c_str()), mode.c_str(), _SH_DENYNO);
#    endif
#    if defined(SPDLOG_PREVENT_CHILD_FD)
    if (*fp != nullptr)
    {
        auto file_handle = reinterpret_cast<HANDLE>(_get_osfhandle(::_fileno(*fp)));
        if (!::SetHandleInformation(file_handle, HANDLE_FLAG_INHERIT, 0))
        {
            ::fclose(*fp);
            *fp = nullptr;
        }
    }
#    endif
#else // unix
#    if defined(SPDLOG_PREVENT_CHILD_FD)
    const int mode_flag = mode == SPDLOG_FILENAME_T("ab") ? O_APPEND : O_TRUNC;
    const int fd = ::open((filename.c_str()), O_CREAT | O_WRONLY | O_CLOEXEC | mode_flag, mode_t(0644));
    if (fd == -1)
    {
        return true;
    }
    *fp = ::fdopen(fd, mode.c_str());
    if (*fp == nullptr)
    {
        ::close(fd);
    }
#    else
    *fp = ::fopen((filename.c_str()), mode.c_str());
#    endif
#endif

    return *fp == nullptr;
}